

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

string * __thiscall
OSTEI_HRR_Writer::HRRKetStepVar_
          (string *__return_storage_ptr__,OSTEI_HRR_Writer *this,Doublet *d,string *brastr)

{
  char *pcVar1;
  int __c;
  undefined4 local_ac;
  string local_a8;
  string arrname;
  undefined1 local_68 [64];
  
  Doublet::Doublet((Doublet *)local_68,d);
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_ac);
  ArrVarName(&arrname,brastr,(Doublet *)local_68,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  local_a8._M_dataplus._M_p._0_4_ = Doublet::ncart(d);
  pcVar1 = Doublet::index(d,(char *)brastr,__c);
  local_ac = SUB84(pcVar1,0);
  StringBuilder<char[5],std::__cxx11::string&,char_const(&)[9],int,char_const(&)[4],int,char_const(&)[2]>
            (__return_storage_ptr__,(char (*) [5])0x13a2cc,&arrname,(char (*) [9])"[ibra * ",
             (int *)&local_a8,(char (*) [4])0x13d019,(int *)&local_ac,(char (*) [2])0x13c125);
  std::__cxx11::string::~string((string *)&arrname);
  return __return_storage_ptr__;
}

Assistant:

std::string OSTEI_HRR_Writer::HRRKetStepVar_(const Doublet & d, const std::string & brastr) const
{
    std::string arrname = ArrVarName(brastr, d);
    return StringBuilder("HRR_", arrname, "[ibra * ", d.ncart(), " + ", d.index(), "]"); 
}